

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O2

void __thiscall xe::TcpIpLink::stopTestProcess(TcpIpLink *this)

{
  CommLinkState CVar1;
  Error *this_00;
  BlockBuffer<unsigned_char> *dst;
  
  CVar1 = TcpIpLinkState::getState(&this->m_state);
  if (CVar1 != COMMLINKSTATE_ERROR) {
    dst = &(this->m_sendThread).m_buffer;
    writeMessageHeader(dst,MESSAGETYPE_STOP_EXECUTION,8);
    de::BlockBuffer<unsigned_char>::flush(dst);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this_00,(char *)0x0,"m_state.getState() != COMMLINKSTATE_ERROR",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
               ,0x22f);
  __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TcpIpLink::stopTestProcess (void)
{
	XE_CHECK(m_state.getState() != COMMLINKSTATE_ERROR);
	writeStopExecution(m_sendThread.getBuffer());
}